

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_resp(Curl_easy *data,connectdata *conn,int imapcode,imapstate instate)

{
  saslprogress local_34;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  saslprogress progress;
  imap_conn *imapc;
  imapstate local_20;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  imapc._4_4_ = 0;
  paStack_30 = &conn->proto;
  local_20 = instate;
  result = imapcode;
  _instate_local = conn;
  conn_local = (connectdata *)data;
  imapc._4_4_ = Curl_sasl_continue(&(conn->proto).imapc.sasl,data,imapcode,&local_34);
  if (imapc._4_4_ == CURLE_OK) {
    if (local_34 == SASL_IDLE) {
      if (((*(byte *)((long)paStack_30 + 0xfb) >> 3 & 1) == 0) &&
         (((paStack_30->imapc).preftype & 1) != 0)) {
        imapc._4_4_ = imap_perform_login((Curl_easy *)conn_local,_instate_local);
      }
      else {
        Curl_failf((Curl_easy *)conn_local,"Authentication cancelled");
        imapc._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    else if (local_34 == SASL_DONE) {
      imap_state((Curl_easy *)conn_local,IMAP_STOP);
    }
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_state_auth_resp(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     int imapcode,
                                     imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  (void)instate; /* no use for this yet */

  result = Curl_sasl_continue(&imapc->sasl, data, imapcode, &progress);
  if(!result)
    switch(progress) {
    case SASL_DONE:
      imap_state(data, IMAP_STOP);  /* Authenticated */
      break;
    case SASL_IDLE:            /* No mechanism left after cancellation */
      if((!imapc->login_disabled) && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
        /* Perform clear text authentication */
        result = imap_perform_login(data, conn);
      else {
        failf(data, "Authentication cancelled");
        result = CURLE_LOGIN_DENIED;
      }
      break;
    default:
      break;
    }

  return result;
}